

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void text_select(t_gobj *z,_glist *glist,int state)

{
  int iVar1;
  char *pcVar2;
  char local_418 [8];
  char buf [1000];
  _rtext *y;
  t_text *x;
  int state_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  buf._992_8_ = glist_findrtext(glist,(t_text *)z);
  rtext_select((_rtext *)buf._992_8_,state);
  iVar1 = glist_isvisible(glist);
  if (iVar1 != 0) {
    iVar1 = gobj_shouldvis(z,glist);
    if (iVar1 != 0) {
      pcVar2 = rtext_gettag((_rtext *)buf._992_8_);
      sprintf(local_418,"%sR",pcVar2);
      pcVar2 = "black";
      if (state != 0) {
        pcVar2 = "blue";
      }
      pdgui_vmess((char *)0x0,"crs rr",glist,"itemconfigure",local_418,"-fill",pcVar2);
    }
  }
  return;
}

Assistant:

static void text_select(t_gobj *z, t_glist *glist, int state)
{
    t_text *x = (t_text *)z;
    t_rtext *y = glist_findrtext(glist, x);
    rtext_select(y, state);
    if (glist_isvisible(glist) && gobj_shouldvis(&x->te_g, glist))
    {
        char buf[MAXPDSTRING];
        sprintf(buf, "%sR", rtext_gettag(y));
        pdgui_vmess(0, "crs rr",
            glist,
            "itemconfigure",
            buf,
            "-fill", (state? "blue" : "black"));
    }
}